

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O3

void * InterpreterThunkEmitter::ConvertToEntryPoint(PVOID dynamicInterpreterThunk)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (dynamicInterpreterThunk == (PVOID)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x14c,"(dynamicInterpreterThunk != nullptr)",
                       "dynamicInterpreterThunk != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (void *)((ulong)dynamicInterpreterThunk & 0xfffffffffffff000);
}

Assistant:

void* InterpreterThunkEmitter::ConvertToEntryPoint(PVOID dynamicInterpreterThunk)
{
    Assert(dynamicInterpreterThunk != nullptr);
    void* entryPoint = (void*)((size_t)dynamicInterpreterThunk & (~((size_t)(BlockSize) - 1)));

#if _M_ARM
    entryPoint = (BYTE*)((DWORD)entryPoint | 0x01);
#endif
    return entryPoint;
}